

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

bool comparesEqual(QProcessEnvironment *lhs,QProcessEnvironment *rhs)

{
  QProcessEnvironmentPrivate *pQVar1;
  QProcessEnvironmentPrivate *pQVar2;
  bool bVar3;
  
  pQVar1 = (rhs->d).d.ptr;
  pQVar2 = (lhs->d).d.ptr;
  if (pQVar2 == pQVar1) {
    return true;
  }
  if (pQVar1 != (QProcessEnvironmentPrivate *)0x0 && pQVar2 != (QProcessEnvironmentPrivate *)0x0) {
    bVar3 = comparesEqual<QByteArray,_QProcEnvValue,_true>(&pQVar2->vars,&pQVar1->vars);
    return bVar3;
  }
  return false;
}

Assistant:

constexpr P get() const noexcept { return ptr; }